

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O1

void __thiscall
presolve::HighsPostsolveStack::fixedColAtLower<HighsTripletListSlice>
          (HighsPostsolveStack *this,HighsInt col,double fixValue,double colCost,
          HighsMatrixSlice<HighsTripletListSlice> *colVec)

{
  int iVar1;
  pointer pNVar2;
  HighsInt *pHVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  long lVar7;
  double *pdVar8;
  int *piVar9;
  long lVar10;
  size_t position;
  ReductionType local_4d;
  HighsInt local_4c;
  double local_48;
  double local_40;
  double local_38;
  
  pNVar2 = (this->colValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->colValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar2) {
    (this->colValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar2;
  }
  lVar10 = (long)colVec->head;
  local_4c = col;
  local_40 = fixValue;
  local_38 = colCost;
  if (lVar10 != -1) {
    pHVar3 = colVec->nodeNext;
    pdVar8 = colVec->nodeValue + lVar10;
    piVar9 = colVec->nodeIndex + lVar10;
    do {
      local_48 = *pdVar8;
      std::
      vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
      ::emplace_back<int&,double>
                ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                  *)&this->colValues,
                 (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + *piVar9,&local_48);
      lVar7 = (long)(int)lVar10;
      lVar10 = (long)pHVar3[lVar7];
      piVar9 = piVar9 + (lVar10 - lVar7);
      pdVar8 = pdVar8 + (lVar10 - lVar7);
    } while (lVar10 != -1);
  }
  pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[local_4c];
  pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<char,_std::allocator<char>_>::resize
            (&(this->reductionValues).data,(size_type)(pcVar4 + (0x18 - (long)pcVar5)));
  pcVar6 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(double *)(pcVar4 + ((long)pcVar6 - (long)pcVar5)) = local_40;
  *(double *)(pcVar4 + (long)(pcVar6 + (8 - (long)pcVar5))) = local_38;
  *(int *)(pcVar4 + (long)(pcVar6 + (0x10 - (long)pcVar5))) = iVar1;
  pcVar4[(long)(pcVar6 + (0x14 - (long)pcVar5))] = '\0';
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,&this->colValues);
  local_4d = kFixedCol;
  local_48 = (double)((long)(this->reductionValues).data.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->reductionValues).data.
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
  ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
            ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
              *)&this->reductions,&local_4d,(unsigned_long *)&local_48);
  return;
}

Assistant:

void fixedColAtLower(HighsInt col, double fixValue, double colCost,
                       const HighsMatrixSlice<ColStorageFormat>& colVec) {
    assert(std::isfinite(fixValue));
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(FixedCol{fixValue, colCost, origColIndex[col],
                                  HighsBasisStatus::kLower});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kFixedCol);
  }